

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement_base.h
# Opt level: O1

void __thiscall
sqlib::statement_base::bind_args<int,std::__cxx11::string>
          (statement_base *this,int n,int *arg,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *rest)

{
  undefined4 in_register_00000034;
  
  sqlite3_bind_int(this->m_prepared,CONCAT44(in_register_00000034,n),*arg);
  sqlite3_bind_text(this->m_prepared,n + 1,(rest->_M_dataplus)._M_p,(int)rest->_M_string_length,
                    0xffffffffffffffff);
  return;
}

Assistant:

void bind_args(int n, const A1& arg, const Rest&... rest) {
    detail::bind_arg(m_prepared, n, arg);
    bind_args(n+1, rest...);
  }